

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_DecompressFastArgs_init
                 (HUF_DecompressFastArgs *args,void *dst,size_t dstSize,void *src,size_t srcSize,
                 HUF_DTable *DTable)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  size_t sVar9;
  byte bVar10;
  BYTE *pBVar11;
  BYTE *istart;
  ulong uVar12;
  bool bVar13;
  
  sVar9 = 0xffffffffffffffec;
  if (9 < srcSize) {
    if (*(char *)((long)DTable + 2) == '\v') {
      uVar5 = *src;
      uVar6 = *(ushort *)((long)src + 2);
      uVar7 = *(ushort *)((long)src + 4);
      uVar12 = (ulong)uVar5 + (ulong)uVar6 + (ulong)uVar7 + 6;
      args->iend[0] = (BYTE *)((long)src + 6);
      pBVar1 = (BYTE *)((long)src + 6) + uVar5;
      args->iend[1] = pBVar1;
      pBVar2 = pBVar1 + uVar6;
      args->iend[2] = pBVar2;
      pBVar3 = pBVar2 + uVar7;
      args->iend[3] = pBVar3;
      bVar13 = srcSize - uVar12 < 8;
      sVar9 = 0xffffffffffffffec;
      if (bVar13 || (7 >= uVar7 || (7 >= uVar6 || 0xf >= uVar5))) {
        sVar9 = 0;
      }
      if ((!bVar13 && (7 < uVar7 && (7 < uVar6 && 0xf < uVar5))) && (uVar12 <= srcSize)) {
        args->ip[0] = pBVar1 + -8;
        args->ip[1] = pBVar2 + -8;
        args->ip[2] = pBVar3 + -8;
        args->ip[3] = (BYTE *)((long)src + (srcSize - 8));
        args->op[0] = (BYTE *)dst;
        uVar12 = dstSize + 3 >> 2;
        args->op[1] = (BYTE *)((long)dst + uVar12);
        pBVar11 = (BYTE *)((long)dst + uVar12) + uVar12;
        args->op[2] = pBVar11;
        args->op[3] = pBVar11 + uVar12;
        if (pBVar11 + uVar12 < (BYTE *)((long)dst + dstSize)) {
          bVar4 = pBVar1[-1];
          iVar8 = 0x1f;
          if (bVar4 != 0) {
            for (; bVar4 >> iVar8 == 0; iVar8 = iVar8 + -1) {
            }
          }
          bVar10 = ~(byte)iVar8 + 9;
          if (bVar4 == 0) {
            bVar10 = 0;
          }
          args->bits[0] = (*(ulong *)(pBVar1 + -8) | 1) << (bVar10 & 0x3f);
          bVar4 = pBVar2[-1];
          iVar8 = 0x1f;
          if (bVar4 != 0) {
            for (; bVar4 >> iVar8 == 0; iVar8 = iVar8 + -1) {
            }
          }
          bVar10 = ~(byte)iVar8 + 9;
          if (bVar4 == 0) {
            bVar10 = 0;
          }
          args->bits[1] = (*(ulong *)(pBVar2 + -8) | 1) << (bVar10 & 0x3f);
          bVar4 = pBVar3[-1];
          iVar8 = 0x1f;
          if (bVar4 != 0) {
            for (; bVar4 >> iVar8 == 0; iVar8 = iVar8 + -1) {
            }
          }
          bVar10 = ~(byte)iVar8 + 9;
          if (bVar4 == 0) {
            bVar10 = 0;
          }
          args->bits[2] = (*(ulong *)(pBVar3 + -8) | 1) << (bVar10 & 0x3f);
          bVar4 = *(byte *)((long)src + (srcSize - 1));
          iVar8 = 0x1f;
          if (bVar4 != 0) {
            for (; bVar4 >> iVar8 == 0; iVar8 = iVar8 + -1) {
            }
          }
          bVar10 = ~(byte)iVar8 + 9;
          if (bVar4 == 0) {
            bVar10 = 0;
          }
          args->bits[3] = (*(ulong *)((long)src + (srcSize - 8)) | 1) << (bVar10 & 0x3f);
          args->ilimit = (BYTE *)((long)src + 0xe);
          args->oend = (BYTE *)((long)dst + dstSize);
          args->dt = DTable + 1;
          sVar9 = 1;
        }
        else {
          sVar9 = 0;
        }
      }
      return sVar9;
    }
    sVar9 = 0;
  }
  return sVar9;
}

Assistant:

static size_t HUF_DecompressFastArgs_init(HUF_DecompressFastArgs* args, void* dst, size_t dstSize, void const* src, size_t srcSize, const HUF_DTable* DTable)
{
    void const* dt = DTable + 1;
    U32 const dtLog = HUF_getDTableDesc(DTable).tableLog;

    const BYTE* const ilimit = (const BYTE*)src + 6 + 8;

    BYTE* const oend = (BYTE*)dst + dstSize;

    /* The fast decoding loop assumes 64-bit little-endian.
     * This condition is false on x32.
     */
    if (!MEM_isLittleEndian() || MEM_32bits())
        return 0;

    /* strict minimum : jump table + 1 byte per stream */
    if (srcSize < 10)
        return ERROR(corruption_detected);

    /* Must have at least 8 bytes per stream because we don't handle initializing smaller bit containers.
     * If table log is not correct at this point, fallback to the old decoder.
     * On small inputs we don't have enough data to trigger the fast loop, so use the old decoder.
     */
    if (dtLog != HUF_DECODER_FAST_TABLELOG)
        return 0;

    /* Read the jump table. */
    {
        const BYTE* const istart = (const BYTE*)src;
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = srcSize - (length1 + length2 + length3 + 6);
        args->iend[0] = istart + 6;  /* jumpTable */
        args->iend[1] = args->iend[0] + length1;
        args->iend[2] = args->iend[1] + length2;
        args->iend[3] = args->iend[2] + length3;

        /* HUF_initFastDStream() requires this, and this small of an input
         * won't benefit from the ASM loop anyways.
         * length1 must be >= 16 so that ip[0] >= ilimit before the loop
         * starts.
         */
        if (length1 < 16 || length2 < 8 || length3 < 8 || length4 < 8)
            return 0;
        if (length4 > srcSize) return ERROR(corruption_detected);   /* overflow */
    }
    /* ip[] contains the position that is currently loaded into bits[]. */
    args->ip[0] = args->iend[1] - sizeof(U64);
    args->ip[1] = args->iend[2] - sizeof(U64);
    args->ip[2] = args->iend[3] - sizeof(U64);
    args->ip[3] = (BYTE const*)src + srcSize - sizeof(U64);

    /* op[] contains the output pointers. */
    args->op[0] = (BYTE*)dst;
    args->op[1] = args->op[0] + (dstSize+3)/4;
    args->op[2] = args->op[1] + (dstSize+3)/4;
    args->op[3] = args->op[2] + (dstSize+3)/4;

    /* No point to call the ASM loop for tiny outputs. */
    if (args->op[3] >= oend)
        return 0;

    /* bits[] is the bit container.
        * It is read from the MSB down to the LSB.
        * It is shifted left as it is read, and zeros are
        * shifted in. After the lowest valid bit a 1 is
        * set, so that CountTrailingZeros(bits[]) can be used
        * to count how many bits we've consumed.
        */
    args->bits[0] = HUF_initFastDStream(args->ip[0]);
    args->bits[1] = HUF_initFastDStream(args->ip[1]);
    args->bits[2] = HUF_initFastDStream(args->ip[2]);
    args->bits[3] = HUF_initFastDStream(args->ip[3]);

    /* If ip[] >= ilimit, it is guaranteed to be safe to
        * reload bits[]. It may be beyond its section, but is
        * guaranteed to be valid (>= istart).
        */
    args->ilimit = ilimit;

    args->oend = oend;
    args->dt = dt;

    return 1;
}